

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_base64_decode(char *src,size_t src_len,uchar *dst,size_t *dst_len)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uchar uVar5;
  int iVar6;
  ulong uVar7;
  ulong local_50;
  size_t dst_len_used;
  size_t dst_len_limit;
  uchar d;
  uchar c;
  uchar b;
  ulong uStack_38;
  uchar a;
  size_t i;
  size_t *dst_len_local;
  uchar *dst_local;
  size_t src_len_local;
  char *src_local;
  
  dst_len_used = 0xffffffffffffffff;
  local_50 = 0;
  if (dst_len != (size_t *)0x0) {
    dst_len_used = *dst_len;
    *dst_len = 0;
  }
  uStack_38 = 0;
  while( true ) {
    if (src_len <= uStack_38) {
      if (local_50 < dst_len_used) {
        dst[local_50] = '\0';
      }
      if (dst_len != (size_t *)0x0) {
        *dst_len = local_50 + 1;
      }
      if (dst_len_used < local_50 + 1) {
        src_local._4_4_ = 0;
      }
      else {
        src_local._4_4_ = -1;
      }
      return src_local._4_4_;
    }
    bVar2 = b64reverse(src[uStack_38]);
    iVar6 = (int)uStack_38;
    if (0xfd < bVar2) {
      return iVar6;
    }
    if (uStack_38 + 1 < src_len) {
      cVar1 = src[uStack_38 + 1];
    }
    else {
      cVar1 = '\0';
    }
    bVar3 = b64reverse(cVar1);
    if (0xfd < bVar3) {
      return iVar6 + 1;
    }
    if (uStack_38 + 2 < src_len) {
      cVar1 = src[uStack_38 + 2];
    }
    else {
      cVar1 = '\0';
    }
    bVar4 = b64reverse(cVar1);
    if (bVar4 == 0xfe) break;
    if (uStack_38 + 3 < src_len) {
      cVar1 = src[uStack_38 + 3];
    }
    else {
      cVar1 = '\0';
    }
    uVar5 = b64reverse(cVar1);
    if (uVar5 == 0xfe) {
      return iVar6 + 3;
    }
    if (local_50 < dst_len_used) {
      dst[local_50] = bVar2 * '\x04' + (char)((int)(uint)bVar3 >> 4);
    }
    uVar7 = local_50 + 1;
    if (bVar4 != 0xff) {
      if (uVar7 < dst_len_used) {
        dst[uVar7] = bVar3 * '\x10' + (char)((int)(uint)bVar4 >> 2);
      }
      uVar7 = local_50 + 2;
      if (uVar5 != 0xff) {
        if (uVar7 < dst_len_used) {
          dst[uVar7] = bVar4 * '@' + uVar5;
        }
        uVar7 = local_50 + 3;
      }
    }
    local_50 = uVar7;
    uStack_38 = uStack_38 + 4;
  }
  return iVar6 + 2;
}

Assistant:

CIVETWEB_API int
mg_base64_decode(const char *src,
                 size_t src_len,
                 unsigned char *dst,
                 size_t *dst_len)
{
	size_t i;
	unsigned char a, b, c, d;
	size_t dst_len_limit = (size_t)-1;
	size_t dst_len_used = 0;

	if (dst_len != NULL) {
		dst_len_limit = *dst_len;
		*dst_len = 0;
	}

	for (i = 0; i < src_len; i += 4) {
		/* Read 4 characters from BASE64 string */
		a = b64reverse(src[i]);
		if (a >= 254) {
			return (int)i;
		}

		b = b64reverse(((i + 1) >= src_len) ? 0 : src[i + 1]);
		if (b >= 254) {
			return (int)i + 1;
		}

		c = b64reverse(((i + 2) >= src_len) ? 0 : src[i + 2]);
		if (c == 254) {
			return (int)i + 2;
		}

		d = b64reverse(((i + 3) >= src_len) ? 0 : src[i + 3]);
		if (d == 254) {
			return (int)i + 3;
		}

		/* Add first (of 3) decoded character */
		if (dst_len_used < dst_len_limit) {
			dst[dst_len_used] = (unsigned char)((unsigned char)(a << 2)
			                                    + (unsigned char)(b >> 4));
		}
		dst_len_used++;

		if (c != 255) {
			if (dst_len_used < dst_len_limit) {

				dst[dst_len_used] = (unsigned char)((unsigned char)(b << 4)
				                                    + (unsigned char)(c >> 2));
			}
			dst_len_used++;
			if (d != 255) {
				if (dst_len_used < dst_len_limit) {
					dst[dst_len_used] =
					    (unsigned char)((unsigned char)(c << 6) + d);
				}
				dst_len_used++;
			}
		}
	}

	/* Add terminating zero */
	if (dst_len_used < dst_len_limit) {
		dst[dst_len_used] = '\0';
	}
	dst_len_used++;
	if (dst_len != NULL) {
		*dst_len = dst_len_used;
	}

	if (dst_len_used > dst_len_limit) {
		/* Out of memory */
		return 0;
	}

	/* Return -1 for "OK" */
	return -1;
}